

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImRect *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiNavLayer IVar5;
  ImGuiContext *pIVar6;
  float fVar7;
  float fVar8;
  
  pIVar6 = GImGui;
  IVar5 = (window->DC).NavLayerCurrent;
  if (GImGui->NavWindow != window) {
    GImGui->NavInitRequest = false;
  }
  pIVar6->NavWindow = window;
  pIVar6->NavId = id;
  pIVar6->NavLayer = IVar5;
  pIVar6->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
  window->NavLastIds[IVar5] = id;
  if ((pIVar6->LastItemData).ID == id) {
    IVar2 = (window->DC).CursorStartPos;
    IVar3 = (pIVar6->LastItemData).NavRect.Min;
    IVar4 = (pIVar6->LastItemData).NavRect.Max;
    fVar7 = IVar2.x;
    fVar8 = IVar2.y;
    pIVar1 = window->NavRectRel + IVar5;
    (pIVar1->Min).x = IVar3.x - fVar7;
    (pIVar1->Min).y = IVar3.y - fVar8;
    (pIVar1->Max).x = IVar4.x - fVar7;
    (pIVar1->Max).y = IVar4.y - fVar8;
  }
  if (pIVar6->ActiveIdSource == ImGuiInputSource_Nav) {
    pIVar6->NavDisableMouseHover = true;
    return;
  }
  pIVar6->NavDisableHighlight = true;
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (g.LastItemData.ID == id)
        window->NavRectRel[nav_layer] = WindowRectAbsToRel(window, g.LastItemData.NavRect);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}